

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

Lf_Cut_t * Lf_ManFetchSet(Lf_Man_t *p,int i)

{
  Gia_Obj_t *pGVar1;
  void *pvVar2;
  void **ppvVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  
  if ((i < 0) || (p->pGia->nObjs <= i)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if ((p->vOffsets).nSize <= i) {
LAB_006d4ce7:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar5 = (p->vOffsets).pArray[(uint)i];
  lVar9 = (long)iVar5;
  if ((lVar9 < 0) || ((p->vCutSets).nSize <= iVar5)) goto LAB_006d4ce7;
  pGVar1 = p->pGia->pObjs + (uint)i;
  uVar6 = (uint)*(undefined8 *)pGVar1;
  if ((((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) ||
     ((((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) ^ uVar6) & 0x1fffffff) == 0)) {
    __assert_fail("Gia_ObjIsAndNotBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x171,"Lf_Cut_t *Lf_ManFetchSet(Lf_Man_t *, int)");
  }
  if (pGVar1->Value == 0) {
    __assert_fail("pObj->Value > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x172,"Lf_Cut_t *Lf_ManFetchSet(Lf_Man_t *, int)");
  }
  uVar6 = (p->vCutSets).pArray[lVar9];
  if (uVar6 != 0xffffffff) {
    uVar4 = pGVar1->Value - 1;
    pGVar1->Value = uVar4;
    if (uVar4 == 0) {
      Vec_IntPush(&p->vFreeSets,uVar6);
      if (iVar5 < (p->vCutSets).nSize) {
        (p->vCutSets).pArray[lVar9] = -1;
        goto LAB_006d4ca3;
      }
      goto LAB_006d4d82;
    }
    goto LAB_006d4ca3;
  }
  if ((p->vFreeSets).nSize == 0) {
    pvVar2 = calloc((long)p->nSetWords << 0xc,8);
    uVar6 = (p->vMemSets).nCap;
    uVar4 = (p->vMemSets).nSize;
    if (uVar4 == uVar6) {
      if ((int)uVar6 < 0x10) {
        ppvVar3 = (p->vMemSets).pArray;
        if (ppvVar3 == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(ppvVar3,0x80);
        }
        (p->vMemSets).pArray = ppvVar3;
        iVar8 = 0x10;
      }
      else {
        iVar8 = uVar6 * 2;
        if (iVar8 <= (int)uVar6) goto LAB_006d4c14;
        ppvVar3 = (p->vMemSets).pArray;
        if (ppvVar3 == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar6 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(ppvVar3,(ulong)uVar6 << 4);
        }
        (p->vMemSets).pArray = ppvVar3;
      }
      (p->vMemSets).nCap = iVar8;
    }
LAB_006d4c14:
    iVar8 = (p->vMemSets).nSize;
    (p->vMemSets).nSize = iVar8 + 1;
    (p->vMemSets).pArray[iVar8] = pvVar2;
    lVar7 = 0x17ffc;
    uVar6 = 0xfff;
    do {
      Vec_IntPush(&p->vFreeSets,uVar4 << 0xc | uVar6);
      *(undefined1 *)((long)pvVar2 + lVar7 + 3) = 0xff;
      lVar7 = lVar7 + -0x18;
      uVar6 = uVar6 - 1;
    } while (lVar7 != -4);
  }
  iVar8 = (p->vFreeSets).nSize;
  if (iVar8 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x396,"int Vec_IntPop(Vec_Int_t *)");
  }
  uVar6 = iVar8 - 1;
  (p->vFreeSets).nSize = uVar6;
  if ((p->vCutSets).nSize <= iVar5) {
LAB_006d4d82:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  uVar6 = (p->vFreeSets).pArray[uVar6];
  (p->vCutSets).pArray[lVar9] = uVar6;
  iVar5 = uVar6 + 1;
  if ((int)(uVar6 + 1) < p->nFrontMax) {
    iVar5 = p->nFrontMax;
  }
  p->nFrontMax = iVar5;
LAB_006d4ca3:
  uVar4 = (int)uVar6 >> 0xc;
  if ((-1 < (int)uVar4) && ((int)uVar4 < (p->vMemSets).nSize)) {
    return (Lf_Cut_t *)
           ((ulong)(uVar6 & 0xfff) * (long)p->nSetWords * 8 + (long)(p->vMemSets).pArray[uVar4]);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

static inline Lf_Cut_t * Lf_ManFetchSet( Lf_Man_t * p, int i )
{
    int uMaskPage = (1 << LF_LOG_PAGE) - 1;
    Gia_Obj_t * pObj = Gia_ManObj( p->pGia, i );
    int iOffSet = Vec_IntEntry( &p->vOffsets, i );
    int Entry = Vec_IntEntry( &p->vCutSets, iOffSet );
    assert( Gia_ObjIsAndNotBuf(pObj) );
    assert( pObj->Value > 0 );
    if ( Entry == -1 ) // first visit
    {
        if ( Vec_IntSize(&p->vFreeSets) == 0 ) // add new
        {
            Lf_Cut_t * pCut = (Lf_Cut_t *)ABC_CALLOC( word, p->nSetWords * (1 << LF_LOG_PAGE) );
            int uMaskShift = Vec_PtrSize(&p->vMemSets) << LF_LOG_PAGE;
            Vec_PtrPush( &p->vMemSets, pCut );
            for ( Entry = uMaskPage; Entry >= 0; Entry-- )
            {
                Vec_IntPush( &p->vFreeSets, uMaskShift | Entry );
                pCut[Entry].nLeaves   = LF_NO_LEAF;
            }
        }
        Entry = Vec_IntPop( &p->vFreeSets );
        Vec_IntWriteEntry( &p->vCutSets, iOffSet, Entry );
        p->nFrontMax = Abc_MaxInt( p->nFrontMax, Entry + 1 );
    }
    else if ( --pObj->Value == 0 )
    {
        Vec_IntPush( &p->vFreeSets, Entry );
        Vec_IntWriteEntry( &p->vCutSets, iOffSet, -1 );
    }
    return (Lf_Cut_t *)((word *)Vec_PtrEntry(&p->vMemSets, Entry >> LF_LOG_PAGE) + p->nSetWords * (Entry & uMaskPage));
}